

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::check_internal_recursion
          (Compiler *this,SPIRType *type,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *checked_ids)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar1;
  bool bVar2;
  size_type sVar3;
  size_t sVar4;
  TypedID *this_00;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar5;
  uint32_t local_64;
  SPIRType *local_60;
  SPIRType *mbr_type;
  uint local_50;
  uint32_t mbr_type_id;
  uint32_t mbr_idx;
  uint32_t mbr_cnt;
  undefined1 local_40;
  uint32_t local_34;
  byte local_2d;
  uint32_t local_2c;
  bool is_recursive;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puStack_28;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *checked_ids_local;
  SPIRType *type_local;
  Compiler *this_local;
  
  if (type->basetype == Struct) {
    puStack_28 = checked_ids;
    checked_ids_local =
         (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *)type;
    type_local = (SPIRType *)this;
    local_2c = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    sVar3 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(checked_ids,&local_2c);
    puVar1 = puStack_28;
    if (sVar3 == 0) {
      local_2d = 0;
      local_34 = TypedID::operator_cast_to_unsigned_int
                           ((TypedID *)&(checked_ids_local->_M_h)._M_bucket_count);
      pVar5 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(puVar1,&local_34);
      _mbr_idx = (__node_type *)pVar5.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_40 = pVar5.second;
      sVar4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                        ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                         &checked_ids_local[2]._M_h._M_element_count);
      mbr_type_id = (uint32_t)sVar4;
      local_50 = 0;
      for (; puVar1 = puStack_28, (local_2d & 1) == 0 && local_50 < mbr_type_id;
          local_2d = (local_2d & 1) != 0 || bVar2) {
        this_00 = (TypedID *)
                  VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                            ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                             &checked_ids_local[2]._M_h._M_element_count,(ulong)local_50);
        mbr_type._4_4_ = TypedID::operator_cast_to_unsigned_int(this_00);
        local_60 = get<spirv_cross::SPIRType>(this,mbr_type._4_4_);
        bVar2 = check_internal_recursion(this,local_60,puStack_28);
        local_50 = local_50 + 1;
      }
      local_64 = TypedID::operator_cast_to_unsigned_int
                           ((TypedID *)&(checked_ids_local->_M_h)._M_bucket_count);
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::erase(puVar1,&local_64);
      this_local._7_1_ = (bool)(local_2d & 1);
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::check_internal_recursion(const SPIRType &type, std::unordered_set<uint32_t> &checked_ids)
{
	if (type.basetype != SPIRType::Struct)
		return false;

	if (checked_ids.count(type.self))
		return true;

	// Recurse into struct members
	bool is_recursive = false;
	checked_ids.insert(type.self);
	uint32_t mbr_cnt = uint32_t(type.member_types.size());
	for (uint32_t mbr_idx = 0; !is_recursive && mbr_idx < mbr_cnt; mbr_idx++)
	{
		uint32_t mbr_type_id = type.member_types[mbr_idx];
		auto &mbr_type = get<SPIRType>(mbr_type_id);
		is_recursive |= check_internal_recursion(mbr_type, checked_ids);
	}
	checked_ids.erase(type.self);
	return is_recursive;
}